

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O0

void __thiscall PruneReplayer::access_pipeline_layout(PruneReplayer *this,Hash hash)

{
  mapped_type pVVar1;
  size_type sVar2;
  mapped_type *ppVVar3;
  uint local_34;
  uint32_t layout;
  VkPipelineLayoutCreateInfo *create_info;
  Hash local_18;
  Hash hash_local;
  PruneReplayer *this_local;
  
  if ((hash != 0) &&
     (local_18 = hash, hash_local = (Hash)this,
     sVar2 = std::
             unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
             ::count(&this->accessed_pipeline_layouts,&local_18), sVar2 == 0)) {
    std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::insert(&this->accessed_pipeline_layouts,&local_18);
    ppVVar3 = std::
              unordered_map<unsigned_long,_const_VkPipelineLayoutCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_VkPipelineLayoutCreateInfo_*>_>_>
              ::operator[](&this->pipeline_layouts,&local_18);
    pVVar1 = *ppVVar3;
    if (pVVar1 != (mapped_type)0x0) {
      for (local_34 = 0; local_34 < pVVar1->setLayoutCount; local_34 = local_34 + 1) {
        access_descriptor_set(this,(Hash)pVVar1->pSetLayouts[local_34]);
      }
    }
  }
  return;
}

Assistant:

void access_pipeline_layout(Hash hash)
	{
		if (!hash)
			return;
		if (accessed_pipeline_layouts.count(hash))
			return;
		accessed_pipeline_layouts.insert(hash);

		auto *create_info = pipeline_layouts[hash];
		if (!create_info)
			return;

		for (uint32_t layout = 0; layout < create_info->setLayoutCount; layout++)
			access_descriptor_set((Hash)create_info->pSetLayouts[layout]);
	}